

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDScanner::scanAttListDecl(DTDScanner *this)

{
  uint uVar1;
  XMLBufferMgr *this_00;
  ReaderMgr *pRVar2;
  DTDGrammar *pDVar3;
  XMLBufferMgr *this_01;
  XMLValidator *this_02;
  DocTypeHandler *pDVar4;
  bool bVar5;
  bool bVar6;
  XMLCh XVar7;
  int iVar8;
  XMLBuffer *toFill;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  XMLBuffer *toFill_00;
  XMLAttDef *pXVar9;
  XMLCh *pXVar10;
  UnexpectedEOFException *this_04;
  XMLBufBid bbName;
  XMLBufBid bbTmp;
  
  bVar6 = checkForPERef(this,false,true);
  if (bVar6) {
    this_00 = this->fBufMgr;
    toFill = XMLBufferMgr::bidOnBuffer(this_00);
    pRVar2 = this->fReaderMgr;
    toFill->fIndex = 0;
    bVar6 = XMLReader::getName(pRVar2->fCurReader,toFill,false);
    if (bVar6) {
      pDVar3 = this->fDTDGrammar;
      uVar1 = this->fEmptyNamespaceId;
      toFill->fBuffer[toFill->fIndex] = L'\0';
      iVar8 = (*(pDVar3->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                        (pDVar3,(ulong)uVar1,0);
      this_03 = (DTDElementDecl *)CONCAT44(extraout_var,iVar8);
      if (this_03 == (DTDElementDecl *)0x0) {
        this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        pXVar10 = toFill->fBuffer;
        pXVar10[toFill->fIndex] = L'\0';
        DTDElementDecl::DTDElementDecl
                  (this_03,pXVar10,this->fEmptyNamespaceId,Any,this->fGrammarPoolMemoryManager);
        (this_03->super_XMLElementDecl).fCreateReason = AttList;
        (this_03->super_XMLElementDecl).fExternalElement =
             this->fDocTypeReaderId != this->fReaderMgr->fCurReader->fReaderNum;
        (*(this->fDTDGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                  (this->fDTDGrammar,this_03,0);
      }
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        (*this->fDocTypeHandler->_vptr_DocTypeHandler[0xe])();
      }
      this_01 = this->fBufMgr;
      toFill_00 = XMLBufferMgr::bidOnBuffer(this_01);
      bVar6 = false;
      do {
        XVar7 = ReaderMgr::peekNextChar(this->fReaderMgr);
        if (XVar7 == L'>') {
          ReaderMgr::getNextChar(this->fReaderMgr);
          bVar5 = false;
        }
        else {
          if (XVar7 == L'\0') {
            this_04 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
            UnexpectedEOFException::UnexpectedEOFException
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                       ,0x292,Gen_UnexpectedEOF,this->fMemoryManager);
            __cxa_throw(this_04,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
          }
          pRVar2 = this->fReaderMgr;
          if ((char)pRVar2->fCurReader->fgCharCharsTable[(ushort)XVar7] < '\0') {
            if (this->fDocTypeHandler == (DocTypeHandler *)0x0) {
              bVar5 = true;
              ReaderMgr::skipPastSpaces(pRVar2);
            }
            else {
              ReaderMgr::getSpaces(pRVar2,toFill_00);
              pDVar4 = this->fDocTypeHandler;
              toFill_00->fBuffer[toFill_00->fIndex] = L'\0';
              bVar5 = true;
              (*pDVar4->_vptr_DocTypeHandler[6])();
            }
          }
          else if (XVar7 == L'%') {
            ReaderMgr::getNextChar(pRVar2);
            bVar5 = true;
            expandPERef(this,false,false,true,false);
          }
          else {
            pXVar9 = scanAttDef(this,this_03,toFill_00);
            bVar5 = pXVar9 != (XMLAttDef *)0x0;
            if (pXVar9 == (XMLAttDef *)0x0) {
              pRVar2 = this->fReaderMgr;
              do {
                XVar7 = ReaderMgr::getNextChar(pRVar2);
                if (XVar7 == L'\0') break;
              } while (XVar7 != L'>');
            }
            else if ((this->fScanner->fValScheme == Val_Always) && (pXVar9->fType == ID)) {
              if (bVar6) {
                this_02 = this->fScanner->fValidator;
                pXVar10 = QName::getRawName((this_03->super_XMLElementDecl).fElementName);
                XMLValidator::emitError
                          (this_02,MultipleIdAttrs,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                bVar6 = true;
              }
              else {
                bVar6 = true;
              }
            }
          }
        }
      } while (bVar5);
      pDVar4 = this->fDocTypeHandler;
      if (pDVar4 != (DocTypeHandler *)0x0) {
        (*pDVar4->_vptr_DocTypeHandler[8])(pDVar4,this_03);
      }
      XMLBufferMgr::releaseBuffer(this_01,toFill_00);
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedElementName);
      pRVar2 = this->fReaderMgr;
      do {
        XVar7 = ReaderMgr::getNextChar(pRVar2);
        if (XVar7 == L'\0') break;
      } while (XVar7 != L'>');
    }
    XMLBufferMgr::releaseBuffer(this_00,toFill);
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    pRVar2 = this->fReaderMgr;
    do {
      XVar7 = ReaderMgr::getNextChar(pRVar2);
      if (XVar7 == L'\0') {
        return;
      }
    } while (XVar7 != L'>');
  }
  return;
}

Assistant:

void DTDScanner::scanAttListDecl()
{
    // Space is required here, so check for a PE ref
    if (!checkForPERef(false, true))
    {
        fScanner->emitError(XMLErrs::ExpectedWhitespace);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    //
    //  Next should be the name of the element it belongs to, so get a buffer
    //  and get the name into it.
    //
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedElementName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    //
    //  Find this element's declaration. If it has not been declared yet,
    //  we will force one into the list, but not mark it as declared.
    //
    DTDElementDecl* elemDecl = (DTDElementDecl*) fDTDGrammar->getElemDecl(fEmptyNamespaceId, 0, bbName.getRawBuffer(), Grammar::TOP_LEVEL_SCOPE);
    if (!elemDecl)
    {
        //
        //  Lets fault in a declaration and add it to the pool. We mark
        //  it having been created because of an attlist. Later, if its
        //  declared, this will be updated.
        //
        elemDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            bbName.getRawBuffer()
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        elemDecl->setCreateReason(XMLElementDecl::AttList);
        elemDecl->setExternalElemDeclaration(isReadingExternalEntity());
        fDTDGrammar->putElemDecl((XMLElementDecl*) elemDecl);
    }

    // If we have a doc type handler, tell it the att list is starting
    if (fDocTypeHandler)
        fDocTypeHandler->startAttList(*elemDecl);

    //
    //  Now we loop until we are done with all of the attributes in this
    //  list. We need a buffer to use for local processing.
    //
    XMLBufBid   bbTmp(fBufMgr);
    XMLBuffer&  tmpBuf = bbTmp.getBuffer();
    bool        seenAnId = false;
    while (true)
    {
        // Get the next char out and see what it tells us to do
        const XMLCh nextCh = fReaderMgr->peekNextChar();

        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chCloseAngle)
        {
            // We are done with this attribute list
            fReaderMgr->getNextChar();
            break;
        }
         else if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
        {
            //
            //  If advanced callbacks are enabled and we have a doc
            //  type handler, then gather up the white space and call
            //  back on the doctype handler. Otherwise, just skip
            //  whitespace.
            //
            if (fDocTypeHandler)
            {
                fReaderMgr->getSpaces(tmpBuf);
                fDocTypeHandler->doctypeWhitespace
                (
                    tmpBuf.getRawBuffer()
                    , tmpBuf.getLen()
                );
            }
             else
            {
                fReaderMgr->skipPastSpaces();
            }
        }
         else if (nextCh == chPercent)
        {
            // Eat the percent and expand the ref
            fReaderMgr->getNextChar();
            expandPERef(false, false, true);
        }
         else
        {
            //
            //  It must be an attribute name, so scan it. We let
            //  it use our local buffer for its name scanning.
            //
            XMLAttDef* attDef = scanAttDef(*elemDecl, tmpBuf);

            if (!attDef)
            {
                fReaderMgr->skipPastChar(chCloseAngle);
                break;
            }

            //
            //  If we are validating and its an ID type, then we have to
            //  make sure that we have not seen an id attribute yet. Set
            //  the flag to say that we've seen one now also.
            //
            if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
            {
                if (attDef->getType() == XMLAttDef::ID)
                {
                    if (seenAnId)
                        fScanner->getValidator()->emitError(XMLValid::MultipleIdAttrs, elemDecl->getFullName());
                    seenAnId = true;
                }
            }
        }
    }

    // If we have a doc type handler, tell it the att list is ending
    if (fDocTypeHandler)
        fDocTypeHandler->endAttList(*elemDecl);
}